

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
ChainstateManager::ProcessNewBlock
          (ChainstateManager *this,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked,bool *new_block)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  _Head_base<0UL,_Chainstate_*,_false> this_00;
  ValidationSignals *this_01;
  bool bVar4;
  bool bVar5;
  Chainstate *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> pblock;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  BlockValidationState bg_state;
  BlockValidationState state;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pindex = (CBlockIndex *)0x0;
  if (new_block != (bool *)0x0) {
    *new_block = false;
  }
  paVar1 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)paVar1;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)paVar2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock34,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x11c3,false);
  bVar4 = CheckBlock((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     &state,&((this->m_options).chainparams)->consensus,true,true);
  if (bVar4) {
    bVar4 = AcceptBlock(this,block,&state,&pindex,force_processing,(FlatFilePos *)0x0,new_block,
                        min_pow_checked);
    if (bVar4) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock34.super_unique_lock);
      ValidationState<BlockValidationResult>::~ValidationState
                (&state.super_ValidationState<BlockValidationResult>);
      NotifyHeaderTip(this);
      state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
      state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
           '\0';
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
           '\0';
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)paVar1;
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)paVar2;
      this_02 = ActiveChainstate(this);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_100,
                 &block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_block;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_100;
      bVar4 = Chainstate::ActivateBestChain(this_02,&state,pblock);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
      if (bVar4) {
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&bg_state,&cs_main,"cs_main"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                   ,0x11e0,false);
        bVar5 = BackgroundSyncInProgress(this);
        this_00._M_head_impl =
             (this->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&bg_state);
        bg_state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
        bg_state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
        bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)&bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
        ;
        bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
        _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf
        [0] = '\0';
        bg_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)&bg_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2
        ;
        bg_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
        bg_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf
        [0] = '\0';
        bVar4 = true;
        if (bVar5 && this_00._M_head_impl != (Chainstate *)0x0) {
          std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_110,
                     &block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
          pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               _Var6._M_pi;
          pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_110;
          bVar5 = Chainstate::ActivateBestChain(this_00._M_head_impl,&bg_state,pblock_00);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
          if (!bVar5) {
            ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                      ((string *)&criticalblock34,
                       &bg_state.super_ValidationState<BlockValidationResult>);
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_len = 0x5e;
            logging_function._M_str = "ProcessNewBlock";
            logging_function._M_len = 0xf;
            LogPrintFormatInternal<char[16],std::__cxx11::string>
                      (logging_function,source_file,0x11e3,ALL,Error,
                       (ConstevalFormatString<2U>)0xcd2661,(char (*) [16])"ProcessNewBlock",
                       (string *)&criticalblock34);
            std::__cxx11::string::~string((string *)&criticalblock34);
            bVar4 = false;
          }
        }
        ValidationState<BlockValidationResult>::~ValidationState
                  (&bg_state.super_ValidationState<BlockValidationResult>);
      }
      else {
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((string *)&bg_state,&state.super_ValidationState<BlockValidationResult>);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x5e;
        logging_function_01._M_str = "ProcessNewBlock";
        logging_function_01._M_len = 0xf;
        LogPrintFormatInternal<char[16],std::__cxx11::string>
                  (logging_function_01,source_file_01,0x11dc,ALL,Error,
                   (ConstevalFormatString<2U>)0xcd263e,(char (*) [16])"ProcessNewBlock",
                   (string *)&bg_state);
        std::__cxx11::string::~string((string *)&bg_state);
        bVar4 = false;
      }
      ValidationState<BlockValidationResult>::~ValidationState
                (&state.super_ValidationState<BlockValidationResult>);
      goto LAB_008b9a5b;
    }
  }
  this_01 = (this->m_options).signals;
  if (this_01 != (ValidationSignals *)0x0) {
    ValidationSignals::BlockChecked
              (this_01,(block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &state);
  }
  ValidationState<BlockValidationResult>::ToString_abi_cxx11_
            ((string *)&bg_state,&state.super_ValidationState<BlockValidationResult>);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file_00._M_len = 0x5e;
  logging_function_00._M_str = "ProcessNewBlock";
  logging_function_00._M_len = 0xf;
  LogPrintFormatInternal<char[16],std::__cxx11::string>
            (logging_function_00,source_file_00,0x11d3,ALL,Error,(ConstevalFormatString<2U>)0xcd2621
             ,(char (*) [16])"ProcessNewBlock",(string *)&bg_state);
  std::__cxx11::string::~string((string *)&bg_state);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock34.super_unique_lock);
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
  bVar4 = false;
LAB_008b9a5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::ProcessNewBlock(const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked, bool* new_block)
{
    AssertLockNotHeld(cs_main);

    {
        CBlockIndex *pindex = nullptr;
        if (new_block) *new_block = false;
        BlockValidationState state;

        // CheckBlock() does not support multi-threaded block validation because CBlock::fChecked can cause data race.
        // Therefore, the following critical section must include the CheckBlock() call as well.
        LOCK(cs_main);

        // Skipping AcceptBlock() for CheckBlock() failures means that we will never mark a block as invalid if
        // CheckBlock() fails.  This is protective against consensus failure if there are any unknown forms of block
        // malleability that cause CheckBlock() to fail; see e.g. CVE-2012-2459 and
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/2019-February/016697.html.  Because CheckBlock() is
        // not very expensive, the anti-DoS benefits of caching failure (of a definitely-invalid block) are not substantial.
        bool ret = CheckBlock(*block, state, GetConsensus());
        if (ret) {
            // Store to disk
            ret = AcceptBlock(block, state, &pindex, force_processing, nullptr, new_block, min_pow_checked);
        }
        if (!ret) {
            if (m_options.signals) {
                m_options.signals->BlockChecked(*block, state);
            }
            LogError("%s: AcceptBlock FAILED (%s)\n", __func__, state.ToString());
            return false;
        }
    }

    NotifyHeaderTip();

    BlockValidationState state; // Only used to report errors, not invalidity - ignore it
    if (!ActiveChainstate().ActivateBestChain(state, block)) {
        LogError("%s: ActivateBestChain failed (%s)\n", __func__, state.ToString());
        return false;
    }

    Chainstate* bg_chain{WITH_LOCK(cs_main, return BackgroundSyncInProgress() ? m_ibd_chainstate.get() : nullptr)};
    BlockValidationState bg_state;
    if (bg_chain && !bg_chain->ActivateBestChain(bg_state, block)) {
        LogError("%s: [background] ActivateBestChain failed (%s)\n", __func__, bg_state.ToString());
        return false;
     }

    return true;
}